

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O0

int PackBitsPreEncode(TIFF *tif,uint16_t s)

{
  uint8_t *puVar1;
  tmsize_t tVar2;
  uint16_t s_local;
  TIFF *tif_local;
  
  puVar1 = (uint8_t *)_TIFFmallocExt(tif,8);
  tif->tif_data = puVar1;
  if (tif->tif_data == (uint8_t *)0x0) {
    tif_local._4_4_ = 0;
  }
  else {
    if ((tif->tif_flags & 0x400) == 0) {
      tVar2 = TIFFScanlineSize(tif);
      *(tmsize_t *)tif->tif_data = tVar2;
    }
    else {
      tVar2 = TIFFTileRowSize(tif);
      *(tmsize_t *)tif->tif_data = tVar2;
    }
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

static int PackBitsPreEncode(TIFF *tif, uint16_t s)
{
    (void)s;

    tif->tif_data = (uint8_t *)_TIFFmallocExt(tif, sizeof(tmsize_t));
    if (tif->tif_data == NULL)
        return (0);
    /*
     * Calculate the scanline/tile-width size in bytes.
     */
    if (isTiled(tif))
        *(tmsize_t *)tif->tif_data = TIFFTileRowSize(tif);
    else
        *(tmsize_t *)tif->tif_data = TIFFScanlineSize(tif);
    return (1);
}